

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O0

void * fy_ensure_lookahead_slow_path(fy_parser *fyp,size_t size,size_t *leftp)

{
  int iVar1;
  undefined1 local_38 [8];
  size_t left;
  void *p;
  size_t *leftp_local;
  size_t size_local;
  fy_parser *fyp_local;
  
  p = leftp;
  if (leftp == (size_t *)0x0) {
    p = local_38;
  }
  leftp_local = (size_t *)size;
  size_local = (size_t)fyp;
  left = (size_t)fy_ptr(fyp,(size_t *)p);
  if (((void *)left == (void *)0x0) || (*p < leftp_local)) {
    fy_parser_diag((fy_parser *)size_local,0x20,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                   ,0x240,"fy_ensure_lookahead_slow_path","ensure lookahead size=%zd left=%zd",
                   leftp_local,*p);
    left = (size_t)fy_parse_input_try_pull
                             ((fy_parser *)size_local,*(fy_input **)(size_local + 0x30),
                              (size_t)leftp_local,(size_t *)p);
    if (((void *)left == (void *)0x0) || (*p < leftp_local)) {
      return (void *)0x0;
    }
    *(size_t *)(size_local + 0x48) = left;
    *(undefined8 *)(size_local + 0x58) = *p;
    iVar1 = fy_utf8_get(*(void **)(size_local + 0x48),(int)*(undefined8 *)(size_local + 0x58),
                        (int *)(size_local + 0x54));
    *(int *)(size_local + 0x50) = iVar1;
  }
  return (void *)left;
}

Assistant:

const void *fy_ensure_lookahead_slow_path(struct fy_parser *fyp, size_t size, size_t *leftp) {
    const void *p;
    size_t left;

    if (!leftp)
        leftp = &left;

    p = fy_ptr(fyp, leftp);
    if (!p || *leftp < size) {
        fyp_scan_debug(fyp, "ensure lookahead size=%zd left=%zd",
                       size, *leftp);

        p = fy_parse_input_try_pull(fyp, fyp->current_input, size, leftp);
        if (!p || *leftp < size)
            return NULL;

        fyp->current_ptr = p;
        fyp->current_left = *leftp;
        fyp->current_c = fy_utf8_get(fyp->current_ptr, fyp->current_left, &fyp->current_w);
    }
    return p;
}